

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LinearQuantizationParams * __thiscall
CoreML::Specification::QuantizationParams::_internal_mutable_linearquantization
          (QuantizationParams *this)

{
  bool bVar1;
  Arena *arena;
  LinearQuantizationParams *pLVar2;
  QuantizationParams *this_local;
  
  bVar1 = _internal_has_linearquantization(this);
  if (!bVar1) {
    clear_QuantizationType(this);
    set_has_linearquantization(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pLVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::LinearQuantizationParams>(arena);
    (this->QuantizationType_).linearquantization_ = pLVar2;
  }
  return (this->QuantizationType_).linearquantization_;
}

Assistant:

inline ::CoreML::Specification::LinearQuantizationParams* QuantizationParams::_internal_mutable_linearquantization() {
  if (!_internal_has_linearquantization()) {
    clear_QuantizationType();
    set_has_linearquantization();
    QuantizationType_.linearquantization_ = CreateMaybeMessage< ::CoreML::Specification::LinearQuantizationParams >(GetArenaForAllocation());
  }
  return QuantizationType_.linearquantization_;
}